

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cjson_add.c
# Opt level: O2

void cjson_add_string_should_add_string(void)

{
  cJSON *object;
  cJSON *pcVar1;
  
  object = cJSON_CreateObject();
  cJSON_AddStringToObject(object,"string","Hello World!");
  pcVar1 = cJSON_GetObjectItemCaseSensitive(object,"string");
  if (pcVar1 == (cJSON *)0x0) {
    UnityFail(" Expected Non-NULL",0xf4);
  }
  UnityAssertEqualNumber((long)pcVar1->type,0x10,(char *)0x0,0xf5,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualString(pcVar1->valuestring,"Hello World!",(char *)0x0,0xf6);
  cJSON_Delete(object);
  return;
}

Assistant:

static void cjson_add_string_should_add_string(void)
{
    cJSON *root = cJSON_CreateObject();
    cJSON *string = NULL;

    cJSON_AddStringToObject(root, "string", "Hello World!");

    TEST_ASSERT_NOT_NULL(string = cJSON_GetObjectItemCaseSensitive(root, "string"));
    TEST_ASSERT_EQUAL_INT(string->type, cJSON_String);
    TEST_ASSERT_EQUAL_STRING(string->valuestring, "Hello World!");

    cJSON_Delete(root);
}